

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclSize.c
# Opt level: O0

int Abc_SclCountBufferFanoutsInt(Abc_Obj_t *pObj)

{
  int iVar1;
  Abc_Obj_t *pObj_00;
  undefined4 local_20;
  undefined4 local_1c;
  int Counter;
  int i;
  Abc_Obj_t *pFanout;
  Abc_Obj_t *pObj_local;
  
  local_20 = 0;
  for (local_1c = 0; iVar1 = Abc_ObjFanoutNum(pObj), local_1c < iVar1; local_1c = local_1c + 1) {
    pObj_00 = Abc_ObjFanout(pObj,local_1c);
    iVar1 = Abc_ObjIsBuffer(pObj_00);
    if (iVar1 != 0) {
      iVar1 = Abc_SclCountBufferFanoutsInt(pObj_00);
      local_20 = iVar1 + local_20;
    }
  }
  iVar1 = Abc_ObjIsBuffer(pObj);
  return local_20 + iVar1;
}

Assistant:

int Abc_SclCountBufferFanoutsInt( Abc_Obj_t * pObj )
{
    Abc_Obj_t * pFanout;
    int i, Counter = 0;
    Abc_ObjForEachFanout( pObj, pFanout, i )
        if ( Abc_ObjIsBuffer(pFanout) )
            Counter += Abc_SclCountBufferFanoutsInt( pFanout );
    return Counter + Abc_ObjIsBuffer(pObj);
}